

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O3

void lddmc_getsha(MDD mdd,char *target)

{
  SHA256_CTX ctx;
  SHA256_CTX local_80;
  
  SHA256_Init((SHA256_CTX *)&local_80);
  lddmc_sha2_rec(mdd,&local_80);
  if (1 < mdd) {
    lddmc_unmark_rec((mddnode_t)(nodes->data + mdd * 0x10));
  }
  SHA256_End(&local_80,target);
  return;
}

Assistant:

void
lddmc_getsha(MDD mdd, char *target)
{
    SHA256_CTX ctx;
    SHA256_Init(&ctx);
    lddmc_sha2_rec(mdd, &ctx);
    if (mdd > lddmc_true) lddmc_unmark_rec(LDD_GETNODE(mdd));
    SHA256_End(&ctx, target);
}